

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLURL.cpp
# Opt level: O0

void __thiscall xercesc_4_0::XMLURL::parse(XMLURL *this,XMLCh *urlText)

{
  bool bVar1;
  Protocols PVar2;
  int iVar3;
  MalformedURLException *pMVar4;
  XMLCh *pXVar5;
  undefined4 extraout_var;
  XMLSize_t XVar6;
  XMLCh *pXVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  XMLCh *local_58;
  XMLCh *ptr2;
  XMLCh *ptr1;
  XMLCh *srcPtr;
  ArrayJanitor<char16_t> janSrcCopy;
  XMLCh *srcCpy;
  XMLCh *urlText_local;
  XMLURL *this_local;
  
  if (*urlText == L'\0') {
    pMVar4 = (MalformedURLException *)__cxa_allocate_exception(0x30);
    MalformedURLException::MalformedURLException
              (pMVar4,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLURL.cpp"
               ,0x3a8,URL_NoProtocolPresent,this->fMemoryManager);
    __cxa_throw(pMVar4,&MalformedURLException::typeinfo,
                MalformedURLException::~MalformedURLException);
  }
  bVar1 = XMLUri::isURIString(urlText);
  if (bVar1) {
    this->fHasInvalidChar = false;
  }
  else {
    this->fHasInvalidChar = true;
  }
  if (((((0x40 < (ushort)*urlText) && ((ushort)*urlText < 0x5b)) ||
       ((0x60 < (ushort)*urlText && ((ushort)*urlText < 0x7b)))) && (urlText[1] == L':')) &&
     ((urlText[2] == L'/' || (urlText[2] == L'\\')))) {
    pMVar4 = (MalformedURLException *)__cxa_allocate_exception(0x30);
    MalformedURLException::MalformedURLException
              (pMVar4,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLURL.cpp"
               ,0x3bd,URL_NoProtocolPresent,this->fMemoryManager);
    __cxa_throw(pMVar4,&MalformedURLException::typeinfo,
                MalformedURLException::~MalformedURLException);
  }
  janSrcCopy.fMemoryManager = (MemoryManager *)XMLString::replicate(urlText,this->fMemoryManager);
  ArrayJanitor<char16_t>::ArrayJanitor
            ((ArrayJanitor<char16_t> *)&srcPtr,(char16_t *)janSrcCopy.fMemoryManager,
             this->fMemoryManager);
  ptr1 = (XMLCh *)janSrcCopy.fMemoryManager;
  while ((*ptr1 != L'\0' && (bVar1 = XMLChar1_0::isWhitespace(*ptr1), bVar1))) {
    ptr1 = ptr1 + 1;
  }
  if (*ptr1 != L'\0') {
    pXVar5 = XMLString::findAny(ptr1,L":/");
    if ((pXVar5 != (XMLCh *)0x0) && (*pXVar5 == L':')) {
      *pXVar5 = L'\0';
      PVar2 = lookupByName(ptr1);
      this->fProtocol = PVar2;
      if (this->fProtocol == Unknown) {
        pMVar4 = (MalformedURLException *)__cxa_allocate_exception(0x30);
        MalformedURLException::MalformedURLException
                  (pMVar4,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLURL.cpp"
                   ,0x3f3,URL_UnsupportedProto1,ptr1,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
                   this->fMemoryManager);
        __cxa_throw(pMVar4,&MalformedURLException::typeinfo,
                    MalformedURLException::~MalformedURLException);
      }
      ptr1 = pXVar5 + 1;
    }
    if ((*ptr1 == L'/') && (ptr1[1] == L'/')) {
      ptr1 = ptr1 + 2;
      if (*ptr1 != L'\0') {
        pXVar5 = XMLString::findAny(ptr1,L"/");
        if (pXVar5 == (XMLCh *)0x0) {
          (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fHost);
          pXVar5 = XMLString::replicate(ptr1,this->fMemoryManager);
          this->fHost = pXVar5;
          XVar6 = XMLString::stringLen(this->fHost);
          ptr1 = ptr1 + XVar6;
        }
        else if (pXVar5 != ptr1) {
          (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fHost);
          iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                            (this->fMemoryManager,(long)pXVar5 + (2 - (long)ptr1));
          this->fHost = (XMLCh *)CONCAT44(extraout_var,iVar3);
          local_58 = this->fHost;
          while (ptr1 < pXVar5) {
            *local_58 = *ptr1;
            local_58 = local_58 + 1;
            ptr1 = ptr1 + 1;
          }
          *local_58 = L'\0';
        }
      }
    }
    else if (this->fProtocol == HTTP) {
      pMVar4 = (MalformedURLException *)__cxa_allocate_exception(0x30);
      MalformedURLException::MalformedURLException
                (pMVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLURL.cpp"
                 ,0x438,URL_ExpectingTwoSlashes,this->fMemoryManager);
      __cxa_throw(pMVar4,&MalformedURLException::typeinfo,
                  MalformedURLException::~MalformedURLException);
    }
    if (this->fHost != (XMLCh *)0x0) {
      pXVar5 = XMLString::findAny(this->fHost,L"@");
      if (pXVar5 != (XMLCh *)0x0) {
        *pXVar5 = L'\0';
        (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fUser);
        pXVar7 = XMLString::replicate(this->fHost,this->fMemoryManager);
        this->fUser = pXVar7;
        XMLString::cut(this->fHost,(long)pXVar5 + (2 - (long)this->fHost) >> 1);
        pXVar5 = XMLString::findAny(this->fUser,L":");
        if (pXVar5 != (XMLCh *)0x0) {
          *pXVar5 = L'\0';
          (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fPassword);
          pXVar5 = XMLString::replicate(pXVar5 + 1,this->fMemoryManager);
          this->fPassword = pXVar5;
        }
      }
      pXVar5 = XMLString::findAny(this->fHost,L":");
      if (pXVar5 != (XMLCh *)0x0) {
        *pXVar5 = L'\0';
        bVar1 = XMLString::textToBin(pXVar5 + 1,&this->fPortNum,this->fMemoryManager);
        if (!bVar1) {
          pMVar4 = (MalformedURLException *)__cxa_allocate_exception(0x30);
          MalformedURLException::MalformedURLException
                    (pMVar4,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLURL.cpp"
                     ,0x46f,URL_BadPortField,this->fMemoryManager);
          __cxa_throw(pMVar4,&MalformedURLException::typeinfo,
                      MalformedURLException::~MalformedURLException);
        }
      }
      if (*this->fHost == L'\0') {
        (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fHost);
        this->fHost = (XMLCh *)0x0;
      }
    }
    if (*ptr1 == L'\0') {
      if (this->fHost != (XMLCh *)0x0) {
        pXVar5 = XMLString::replicate(L"/",this->fMemoryManager);
        this->fPath = pXVar5;
      }
    }
    else {
      pXVar5 = XMLString::findAny(ptr1,L"#?");
      if (pXVar5 == (XMLCh *)0x0) {
        (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fPath);
        pXVar5 = XMLString::replicate(ptr1,this->fMemoryManager);
        this->fPath = pXVar5;
      }
      else {
        if (ptr1 < pXVar5) {
          (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fPath);
          iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                            (this->fMemoryManager,(long)pXVar5 + (2 - (long)ptr1));
          this->fPath = (XMLCh *)CONCAT44(extraout_var_00,iVar3);
          local_58 = this->fPath;
          while (ptr1 < pXVar5) {
            *local_58 = *ptr1;
            local_58 = local_58 + 1;
            ptr1 = ptr1 + 1;
          }
          *local_58 = L'\0';
        }
        if (*ptr1 == L'#') {
          (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fFragment);
          pXVar5 = XMLString::replicate(ptr1 + 1,this->fMemoryManager);
          this->fFragment = pXVar5;
        }
        else {
          ptr1 = ptr1 + 1;
          pXVar5 = XMLString::findAny(ptr1,L"#");
          (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fQuery);
          if (pXVar5 == (XMLCh *)0x0) {
            pXVar5 = XMLString::replicate(ptr1,this->fMemoryManager);
            this->fQuery = pXVar5;
          }
          else {
            iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                              (this->fMemoryManager,(long)pXVar5 + (2 - (long)ptr1));
            this->fQuery = (XMLCh *)CONCAT44(extraout_var_01,iVar3);
            local_58 = this->fQuery;
            while (ptr1 < pXVar5) {
              *local_58 = *ptr1;
              local_58 = local_58 + 1;
              ptr1 = ptr1 + 1;
            }
            *local_58 = L'\0';
            if (*ptr1 == L'#') {
              (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fFragment);
              pXVar5 = XMLString::replicate(ptr1 + 1,this->fMemoryManager);
              this->fFragment = pXVar5;
            }
          }
        }
      }
    }
    ArrayJanitor<char16_t>::~ArrayJanitor((ArrayJanitor<char16_t> *)&srcPtr);
    return;
  }
  pMVar4 = (MalformedURLException *)__cxa_allocate_exception(0x30);
  MalformedURLException::MalformedURLException
            (pMVar4,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLURL.cpp"
             ,0x3d6,URL_NoProtocolPresent,this->fMemoryManager);
  __cxa_throw(pMVar4,&MalformedURLException::typeinfo,MalformedURLException::~MalformedURLException)
  ;
}

Assistant:

void XMLURL::parse(const XMLCh* const urlText)
{
    // Simplify things by checking for the psycho scenarios first
    if (!*urlText)
        ThrowXMLwithMemMgr(MalformedURLException, XMLExcepts::URL_NoProtocolPresent, fMemoryManager);

    // Before we start, check if this urlText contains valid uri characters
    if (!XMLUri::isURIString(urlText))
        fHasInvalidChar = true;
    else
        fHasInvalidChar = false;

    //
    //  The first thing we will do is to check for a file name, so that
    //  we don't waste time thinking its a URL. If its in the form x:\ or x:/
    //  and x is an ASCII letter, then assume that's the deal.
    //
    if (((*urlText >= chLatin_A) && (*urlText <= chLatin_Z))
    ||  ((*urlText >= chLatin_a) && (*urlText <= chLatin_z)))
    {
        if (*(urlText + 1) == chColon)
        {
            if ((*(urlText + 2) == chForwardSlash)
            ||  (*(urlText + 2) == chBackSlash))
            {
                ThrowXMLwithMemMgr(MalformedURLException, XMLExcepts::URL_NoProtocolPresent, fMemoryManager);
            }
        }
    }

    // Get a copy of the URL that we can modify
    XMLCh* srcCpy = XMLString::replicate(urlText, fMemoryManager);
    ArrayJanitor<XMLCh> janSrcCopy(srcCpy, fMemoryManager);

    //
    //  Get a pointer now that we can run up thrown the source as we parse
    //  bits and pieces out of it.
    //
    XMLCh* srcPtr = srcCpy;

    // Run up past any spaces
    while (*srcPtr)
    {
        if (!XMLChar1_0::isWhitespace(*srcPtr))
            break;
        srcPtr++;
    }

    // Make sure it wasn't all space
    if (!*srcPtr)
        ThrowXMLwithMemMgr(MalformedURLException, XMLExcepts::URL_NoProtocolPresent, fMemoryManager);

    //
    //  Ok, the next thing we have to do is to find either a / or : character.
    //  If the : is first, we assume we have a protocol. If the / is first,
    //  then we skip to the host processing.
    //
    XMLCh* ptr1 = XMLString::findAny(srcPtr, gListOne);
    XMLCh* ptr2;

    // If we found a protocol, then deal with it
    if (ptr1)
    {
        if (*ptr1 == chColon)
        {
            // Cap the string at the colon
            *ptr1 = 0;

            // And try to find it in our list of protocols
            fProtocol = lookupByName(srcPtr);

            if (fProtocol == Unknown)
            {
                ThrowXMLwithMemMgr1
                (
                    MalformedURLException
                    , XMLExcepts::URL_UnsupportedProto1
                    , srcPtr
                    , fMemoryManager
                );
            }

            // And move our source pointer up past what we've processed
            srcPtr = (ptr1 + 1);
        }
    }

    //
    //  Ok, next we need to see if we have any host part. If the next
    //  two characters are //, then we need to check, else move on.
    //
    if ((*srcPtr == chForwardSlash) && (*(srcPtr + 1) == chForwardSlash))
    {
        // Move up past the slashes
        srcPtr += 2;

        //
        //  If we aren't at the end of the string, then there has to be a
        //  host part at this point. we will just look for the next / char
        //  or end of string and make all of that the host for now.
        //
        if (*srcPtr)
        {
            // Search from here for a / character
            ptr1 = XMLString::findAny(srcPtr, gListFour);

            //
            //  If we found something, then the host is between where
            //  we are and what we found. Else the host is the rest of
            //  the content and we are done. If its empty, leave it null.
            //
            if (ptr1)
            {
                if (ptr1 != srcPtr)
                {
                    fMemoryManager->deallocate(fHost);//delete [] fHost;
                    fHost = (XMLCh*) fMemoryManager->allocate
                    (
                        ((ptr1 - srcPtr) + 1) * sizeof(XMLCh)
                    );//new XMLCh[(ptr1 - srcPtr) + 1];
                    ptr2 = fHost;
                    while (srcPtr < ptr1)
                        *ptr2++ = *srcPtr++;
                    *ptr2 = 0;
                }
            }
             else
            {
                fMemoryManager->deallocate(fHost);//delete [] fHost;
                fHost = XMLString::replicate(srcPtr, fMemoryManager);

                // Update source pointer to the end
                srcPtr += XMLString::stringLen(fHost);
            }
        }
    }
    else
    {
        //
        // http protocol requires two forward slashes
        // we didn't get them, so throw an exception
        //
        if (fProtocol == HTTP) {
            ThrowXMLwithMemMgr
                (
                    MalformedURLException
                    , XMLExcepts::URL_ExpectingTwoSlashes
                    , fMemoryManager
                );
        }
    }

    //
    //  If there was a host part, then we have to grovel through it for
    //  all the bits and pieces it can hold.
    //
    if (fHost)
    {
        //
        //  Look for a '@' character, which indicates a user name. If we
        //  find one, then everything between the start of the host data
        //  and the character is the user name.
        //
        ptr1 = XMLString::findAny(fHost, gListTwo);
        if (ptr1)
        {
            // Get this info out as the user name
            *ptr1 = 0;
            fMemoryManager->deallocate(fUser);//delete [] fUser;
            fUser = XMLString::replicate(fHost, fMemoryManager);
            ptr1++;

            // And now cut these chars from the host string
            XMLString::cut(fHost, ptr1 - fHost);

            // Is there a password inside the user string?
            ptr2 = XMLString::findAny(fUser, gListThree);
            if (ptr2)
            {
                // Remove it from the user name string
                *ptr2 = 0;

                // And copy out the remainder to the password field
                ptr2++;
                fMemoryManager->deallocate(fPassword);//delete [] fPassword;
                fPassword = XMLString::replicate(ptr2, fMemoryManager);
            }
        }

        //
        //  Ok, so now we are at the actual host name, if any. If we are
        //  not at the end of the host data, then lets see if we have a
        //  port trailing the
        //
        ptr1 = XMLString::findAny(fHost, gListThree);
        if (ptr1)
        {
            // Remove it from the host name
            *ptr1 = 0;

            // Try to convert it to a numeric port value and store it
            ptr1++;
            if (!XMLString::textToBin(ptr1, fPortNum, fMemoryManager))
                ThrowXMLwithMemMgr(MalformedURLException, XMLExcepts::URL_BadPortField, fMemoryManager);
        }

        // If the host ended up empty, then toss is
        if (!*fHost)
        {
            fMemoryManager->deallocate(fHost);//delete[] fHost;
            fHost = 0;
        }
    }

    // If we are at the end, then we are done now
    if (!*srcPtr) {
        if(fHost) {
            static const XMLCh slash[] = { chForwardSlash, chNull };
            fPath = XMLString::replicate(slash, fMemoryManager);
        }
        return;
    }

    //
    //  Next is the path part. It can be absolute, i.e. starting with a
    //  forward slash character, or relative. Its basically everything up
    //  to the end of the string or to any trailing query or fragment.
    //
    ptr1 = XMLString::findAny(srcPtr, gListFive);
    if (!ptr1)
    {
        fMemoryManager->deallocate(fPath);//delete [] fPath;
        fPath = XMLString::replicate(srcPtr, fMemoryManager);
        return;
    }

    // Everything from where we are to what we found is the path
    if (ptr1 > srcPtr)
    {
        fMemoryManager->deallocate(fPath);//delete [] fPath;
        fPath = (XMLCh*) fMemoryManager->allocate
        (
            ((ptr1 - srcPtr) + 1) * sizeof(XMLCh)
        );//new XMLCh[(ptr1 - srcPtr) + 1];
        ptr2 = fPath;
        while (srcPtr < ptr1)
            *ptr2++ = *srcPtr++;
        *ptr2 = 0;
    }

    //
    //  If we found a fragment, then it is the rest of the string and we
    //  are done.
    //
    if (*srcPtr == chPound)
    {
        srcPtr++;
        fMemoryManager->deallocate(fFragment);//delete [] fFragment;
        fFragment = XMLString::replicate(srcPtr, fMemoryManager);
        return;
    }

    //
    //  The query is either the rest of the string, or up to the fragment
    //  separator.
    //
    srcPtr++;
    ptr1 = XMLString::findAny(srcPtr, gListSix);
    fMemoryManager->deallocate(fQuery);//delete [] fQuery;
    if (!ptr1)
    {
        fQuery = XMLString::replicate(srcPtr, fMemoryManager);
        return;
    }
     else
    {
        fQuery = (XMLCh*) fMemoryManager->allocate
        (
            ((ptr1 - srcPtr) + 1) * sizeof(XMLCh)
        );//new XMLCh[(ptr1 - srcPtr) + 1];
        ptr2 = fQuery;
        while (srcPtr < ptr1)
            *ptr2++ = *srcPtr++;
        *ptr2 = 0;
    }

    // If we are not at the end now, then everything else is the fragment
    if (*srcPtr == chPound)
    {
        srcPtr++;
        fMemoryManager->deallocate(fFragment);//delete [] fFragment;
        fFragment = XMLString::replicate(srcPtr, fMemoryManager);
    }
}